

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O3

void idct16x16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar32;
  int iVar33;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar40;
  int iVar41;
  int iVar44;
  int iVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar46;
  int iVar47;
  int iVar49;
  int iVar50;
  undefined1 auVar48 [16];
  int iVar51;
  int iVar52;
  uint uVar53;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar61;
  undefined1 auVar56 [16];
  uint uVar62;
  int iVar63;
  int iVar64;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar71;
  int iVar72;
  uint uVar73;
  uint uVar76;
  int iVar77;
  uint uVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  int iVar79;
  uint uVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  int iVar97;
  int iVar98;
  int iVar99;
  uint uVar100;
  int iVar101;
  int iVar106;
  int iVar109;
  undefined1 auVar102 [16];
  uint uVar107;
  uint uVar110;
  int iVar112;
  uint uVar113;
  undefined1 auVar103 [16];
  int iVar108;
  int iVar111;
  int iVar114;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar115;
  int iVar116;
  int iVar119;
  int iVar121;
  undefined1 auVar117 [16];
  int iVar120;
  int iVar122;
  int iVar123;
  int iVar124;
  undefined1 auVar118 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  undefined1 local_d8 [16];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  int local_38;
  int iStack_34;
  int iStack_30;
  int iStack_2c;
  
  lVar5 = (long)bit * 0x100;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x170);
  iVar8 = -iVar27;
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x1f0);
  iVar6 = -iVar28;
  iVar3 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x1b0);
  iVar7 = 1 << ((char)bit - 1U & 0x1f);
  iVar9 = -iVar3;
  iVar4 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x230);
  iVar2 = -iVar4;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x250);
  auVar55._4_4_ = uVar1;
  auVar55._0_4_ = uVar1;
  auVar55._8_4_ = uVar1;
  auVar55._12_4_ = uVar1;
  auVar12._4_4_ = iVar8;
  auVar12._0_4_ = iVar8;
  auVar12._8_4_ = iVar8;
  auVar12._12_4_ = iVar8;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1d0);
  auVar75._4_4_ = uVar1;
  auVar75._0_4_ = uVar1;
  auVar75._8_4_ = uVar1;
  auVar75._12_4_ = uVar1;
  auVar38._4_4_ = iVar6;
  auVar38._0_4_ = iVar6;
  auVar38._8_4_ = iVar6;
  auVar38._12_4_ = iVar6;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x210);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar54._4_4_ = iVar9;
  auVar54._0_4_ = iVar9;
  auVar54._8_4_ = iVar9;
  auVar54._12_4_ = iVar9;
  local_d8._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 400);
  local_d8._0_4_ = local_d8._4_4_;
  local_d8._8_4_ = local_d8._4_4_;
  local_d8._12_4_ = local_d8._4_4_;
  auVar31._4_4_ = iVar28;
  auVar31._0_4_ = iVar28;
  auVar31._8_4_ = iVar28;
  auVar31._12_4_ = iVar28;
  auVar37._4_4_ = iVar27;
  auVar37._0_4_ = iVar27;
  auVar37._8_4_ = iVar27;
  auVar37._12_4_ = iVar27;
  auVar30 = pmulld(auVar37,(undefined1  [16])in[1]);
  auVar102 = pmulld((undefined1  [16])in[1],auVar55);
  auVar12 = pmulld(auVar12,(undefined1  [16])in[0xf]);
  auVar35 = pmulld(auVar31,(undefined1  [16])in[9]);
  auVar117 = pmulld((undefined1  [16])in[9],auVar75);
  auVar42 = pmulld(auVar38,(undefined1  [16])in[7]);
  auVar10._4_4_ = iVar3;
  auVar10._0_4_ = iVar3;
  auVar10._8_4_ = iVar3;
  auVar10._12_4_ = iVar3;
  auVar15 = pmulld(auVar10,(undefined1  [16])in[5]);
  auVar43 = pmulld((undefined1  [16])in[5],auVar13);
  auVar65 = pmulld(auVar54,(undefined1  [16])in[0xb]);
  auVar74._4_4_ = iVar2;
  auVar74._0_4_ = iVar2;
  auVar74._8_4_ = iVar2;
  auVar74._12_4_ = iVar2;
  auVar48._4_4_ = iVar4;
  auVar48._0_4_ = iVar4;
  auVar48._8_4_ = iVar4;
  auVar48._12_4_ = iVar4;
  auVar48 = pmulld(auVar48,(undefined1  [16])in[0xd]);
  auVar66 = pmulld((undefined1  [16])in[0xd],local_d8);
  auVar74 = pmulld(auVar74,(undefined1  [16])in[3]);
  auVar54 = pmulld((undefined1  [16])in[3],local_d8);
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x180);
  iVar3 = -iVar27;
  auVar10 = pmulld((undefined1  [16])in[0xb],auVar13);
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x200);
  iVar4 = -iVar28;
  auVar89 = pmulld((undefined1  [16])in[7],auVar75);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x240);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar90._4_4_ = iVar3;
  auVar90._0_4_ = iVar3;
  auVar90._8_4_ = iVar3;
  auVar90._12_4_ = iVar3;
  auVar91._4_4_ = iVar27;
  auVar91._0_4_ = iVar27;
  auVar91._8_4_ = iVar27;
  auVar91._12_4_ = iVar27;
  auVar37 = pmulld((undefined1  [16])in[0xf],auVar55);
  local_118 = auVar30._0_4_;
  iStack_114 = auVar30._4_4_;
  iStack_110 = auVar30._8_4_;
  iStack_10c = auVar30._12_4_;
  auVar55 = pmulld(auVar91,(undefined1  [16])in[2]);
  auVar31 = pmulld((undefined1  [16])in[2],auVar16);
  auVar91 = pmulld(auVar90,(undefined1  [16])in[0xe]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1c0);
  auVar92._4_4_ = uVar1;
  auVar92._0_4_ = uVar1;
  auVar92._8_4_ = uVar1;
  auVar92._12_4_ = uVar1;
  auVar30._4_4_ = iVar4;
  auVar30._0_4_ = iVar4;
  auVar30._8_4_ = iVar4;
  auVar30._12_4_ = iVar4;
  auVar36._4_4_ = iVar28;
  auVar36._0_4_ = iVar28;
  auVar36._8_4_ = iVar28;
  auVar36._12_4_ = iVar28;
  auVar38 = pmulld(auVar36,(undefined1  [16])in[10]);
  auVar75 = pmulld((undefined1  [16])in[10],auVar92);
  auVar30 = pmulld(auVar30,(undefined1  [16])in[6]);
  auVar36 = pmulld((undefined1  [16])in[6],auVar92);
  auVar13 = ZEXT416((uint)bit);
  auVar16 = pmulld((undefined1  [16])in[0xe],auVar16);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar5 + 0x1e0);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  iVar99 = auVar102._0_4_ + iVar7 + auVar12._0_4_ >> auVar13;
  iVar106 = auVar102._4_4_ + iVar7 + auVar12._4_4_ >> auVar13;
  iVar109 = auVar102._8_4_ + iVar7 + auVar12._8_4_ >> auVar13;
  iVar112 = auVar102._12_4_ + iVar7 + auVar12._12_4_ >> auVar13;
  iVar115 = auVar117._0_4_ + iVar7 + auVar42._0_4_ >> auVar13;
  iVar119 = auVar117._4_4_ + iVar7 + auVar42._4_4_ >> auVar13;
  iVar121 = auVar117._8_4_ + iVar7 + auVar42._8_4_ >> auVar13;
  iVar123 = auVar117._12_4_ + iVar7 + auVar42._12_4_ >> auVar13;
  iVar41 = auVar43._0_4_ + iVar7 + auVar65._0_4_ >> auVar13;
  iVar44 = auVar43._4_4_ + iVar7 + auVar65._4_4_ >> auVar13;
  iVar45 = auVar43._8_4_ + iVar7 + auVar65._8_4_ >> auVar13;
  iVar46 = auVar43._12_4_ + iVar7 + auVar65._12_4_ >> auVar13;
  iVar63 = auVar66._0_4_ + iVar7 + auVar74._0_4_ >> auVar13;
  iVar67 = auVar66._4_4_ + iVar7 + auVar74._4_4_ >> auVar13;
  iVar69 = auVar66._8_4_ + iVar7 + auVar74._8_4_ >> auVar13;
  iVar71 = auVar66._12_4_ + iVar7 + auVar74._12_4_ >> auVar13;
  iVar47 = auVar48._0_4_ + iVar7 + auVar54._0_4_ >> auVar13;
  iVar49 = auVar48._4_4_ + iVar7 + auVar54._4_4_ >> auVar13;
  iVar50 = auVar48._8_4_ + iVar7 + auVar54._8_4_ >> auVar13;
  iVar51 = auVar48._12_4_ + iVar7 + auVar54._12_4_ >> auVar13;
  iVar27 = auVar15._0_4_ + iVar7 + auVar10._0_4_ >> auVar13;
  iVar28 = auVar15._4_4_ + iVar7 + auVar10._4_4_ >> auVar13;
  iVar3 = auVar15._8_4_ + iVar7 + auVar10._8_4_ >> auVar13;
  iVar4 = auVar15._12_4_ + iVar7 + auVar10._12_4_ >> auVar13;
  iVar2 = auVar35._0_4_ + iVar7 + auVar89._0_4_ >> auVar13;
  iVar6 = auVar35._4_4_ + iVar7 + auVar89._4_4_ >> auVar13;
  iVar8 = auVar35._8_4_ + iVar7 + auVar89._8_4_ >> auVar13;
  iVar9 = auVar35._12_4_ + iVar7 + auVar89._12_4_ >> auVar13;
  iVar87 = local_118 + iVar7 + auVar37._0_4_ >> auVar13;
  iVar93 = iStack_114 + iVar7 + auVar37._4_4_ >> auVar13;
  iVar95 = iStack_110 + iVar7 + auVar37._8_4_ >> auVar13;
  iVar97 = iStack_10c + iVar7 + auVar37._12_4_ >> auVar13;
  iVar14 = iVar115 + iVar99;
  iVar17 = iVar119 + iVar106;
  iVar19 = iVar121 + iVar109;
  iVar23 = iVar123 + iVar112;
  iVar99 = iVar99 - iVar115;
  iVar106 = iVar106 - iVar119;
  iVar109 = iVar109 - iVar121;
  iVar112 = iVar112 - iVar123;
  iVar115 = iVar63 + iVar41;
  iVar121 = iVar67 + iVar44;
  iVar20 = iVar69 + iVar45;
  iVar24 = iVar71 + iVar46;
  iVar63 = iVar63 - iVar41;
  iVar67 = iVar67 - iVar44;
  iVar69 = iVar69 - iVar45;
  iVar71 = iVar71 - iVar46;
  iVar46 = iVar27 + iVar47;
  iVar123 = iVar28 + iVar49;
  iVar21 = iVar3 + iVar50;
  iVar25 = iVar4 + iVar51;
  iVar47 = iVar47 - iVar27;
  iVar49 = iVar49 - iVar28;
  iVar50 = iVar50 - iVar3;
  iVar51 = iVar51 - iVar4;
  iVar119 = iVar87 + iVar2;
  iVar18 = iVar93 + iVar6;
  iVar22 = iVar95 + iVar8;
  iVar26 = iVar97 + iVar9;
  iVar87 = iVar87 - iVar2;
  iVar93 = iVar93 - iVar6;
  iVar95 = iVar95 - iVar8;
  iVar97 = iVar97 - iVar9;
  auVar12 = pmulld((undefined1  [16])*in,auVar11);
  auVar10 = pmulld((undefined1  [16])in[8],auVar11);
  iVar64 = auVar12._0_4_ + iVar7;
  iVar68 = auVar12._4_4_ + iVar7;
  iVar70 = auVar12._8_4_ + iVar7;
  iVar72 = auVar12._12_4_ + iVar7;
  iVar27 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x220);
  iVar28 = *(int *)((long)vert_filter_length_chroma + lVar5 + 0x1a0);
  iVar3 = -iVar28;
  auVar42._4_4_ = iVar27;
  auVar42._0_4_ = iVar27;
  auVar42._8_4_ = iVar27;
  auVar42._12_4_ = iVar27;
  auVar15._4_4_ = iVar3;
  auVar15._0_4_ = iVar3;
  auVar15._8_4_ = iVar3;
  auVar15._12_4_ = iVar3;
  auVar48 = pmulld((undefined1  [16])in[4],auVar42);
  auVar43 = pmulld((undefined1  [16])in[0xc],auVar15);
  auVar35._4_4_ = iVar28;
  auVar35._0_4_ = iVar28;
  auVar35._8_4_ = iVar28;
  auVar35._12_4_ = iVar28;
  auVar37 = pmulld((undefined1  [16])in[4],auVar35);
  auVar12 = pmulld((undefined1  [16])in[0xc],auVar42);
  iVar29 = auVar31._0_4_ + iVar7 + auVar91._0_4_ >> auVar13;
  iVar32 = auVar31._4_4_ + iVar7 + auVar91._4_4_ >> auVar13;
  iVar33 = auVar31._8_4_ + iVar7 + auVar91._8_4_ >> auVar13;
  iVar34 = auVar31._12_4_ + iVar7 + auVar91._12_4_ >> auVar13;
  iVar2 = auVar75._0_4_ + iVar7 + auVar30._0_4_ >> auVar13;
  iVar8 = auVar75._4_4_ + iVar7 + auVar30._4_4_ >> auVar13;
  iVar41 = auVar75._8_4_ + iVar7 + auVar30._8_4_ >> auVar13;
  iVar45 = auVar75._12_4_ + iVar7 + auVar30._12_4_ >> auVar13;
  iVar28 = auVar38._0_4_ + iVar7 + auVar36._0_4_ >> auVar13;
  iVar3 = auVar38._4_4_ + iVar7 + auVar36._4_4_ >> auVar13;
  iVar39 = auVar38._8_4_ + iVar7 + auVar36._8_4_ >> auVar13;
  iVar40 = auVar38._12_4_ + iVar7 + auVar36._12_4_ >> auVar13;
  iVar52 = auVar55._0_4_ + iVar7 + auVar16._0_4_ >> auVar13;
  iVar57 = auVar55._4_4_ + iVar7 + auVar16._4_4_ >> auVar13;
  iVar59 = auVar55._8_4_ + iVar7 + auVar16._8_4_ >> auVar13;
  iVar61 = auVar55._12_4_ + iVar7 + auVar16._12_4_ >> auVar13;
  iVar4 = iVar2 + iVar29;
  iVar6 = iVar8 + iVar32;
  iVar9 = iVar41 + iVar33;
  iVar44 = iVar45 + iVar34;
  iVar29 = iVar29 - iVar2;
  iVar32 = iVar32 - iVar8;
  iVar33 = iVar33 - iVar41;
  iVar34 = iVar34 - iVar45;
  iVar2 = iVar52 + iVar28;
  iVar8 = iVar57 + iVar3;
  iVar41 = iVar59 + iVar39;
  iVar45 = iVar61 + iVar40;
  iVar52 = iVar52 - iVar28;
  iVar57 = iVar57 - iVar3;
  iVar59 = iVar59 - iVar39;
  iVar61 = iVar61 - iVar40;
  iVar27 = -iVar27;
  iVar3 = bd + (uint)(do_cols == 0) * 2;
  iVar28 = 0x8000;
  if (0xf < iVar3 + 6) {
    iVar28 = 1 << ((char)iVar3 + 5U & 0x1f);
  }
  iVar3 = -iVar28;
  iVar28 = iVar28 + -1;
  uVar100 = (uint)(iVar99 < iVar3) * iVar3 | (uint)(iVar99 >= iVar3) * iVar99;
  uVar107 = (uint)(iVar106 < iVar3) * iVar3 | (uint)(iVar106 >= iVar3) * iVar106;
  uVar110 = (uint)(iVar109 < iVar3) * iVar3 | (uint)(iVar109 >= iVar3) * iVar109;
  uVar113 = (uint)(iVar112 < iVar3) * iVar3 | (uint)(iVar112 >= iVar3) * iVar112;
  auVar103._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar103._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar103._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar103._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar87 < iVar3) * iVar3 | (uint)(iVar87 >= iVar3) * iVar87;
  uVar107 = (uint)(iVar93 < iVar3) * iVar3 | (uint)(iVar93 >= iVar3) * iVar93;
  uVar110 = (uint)(iVar95 < iVar3) * iVar3 | (uint)(iVar95 >= iVar3) * iVar95;
  uVar113 = (uint)(iVar97 < iVar3) * iVar3 | (uint)(iVar97 >= iVar3) * iVar97;
  auVar89._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar89._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar89._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar89._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  auVar38 = pmulld(auVar103,auVar15);
  auVar30 = pmulld(auVar89,auVar42);
  auVar65._4_4_ = iVar27;
  auVar65._0_4_ = iVar27;
  auVar65._8_4_ = iVar27;
  auVar65._12_4_ = iVar27;
  uVar100 = (uint)(iVar63 < iVar3) * iVar3 | (uint)(iVar63 >= iVar3) * iVar63;
  uVar107 = (uint)(iVar67 < iVar3) * iVar3 | (uint)(iVar67 >= iVar3) * iVar67;
  uVar110 = (uint)(iVar69 < iVar3) * iVar3 | (uint)(iVar69 >= iVar3) * iVar69;
  uVar113 = (uint)(iVar71 < iVar3) * iVar3 | (uint)(iVar71 >= iVar3) * iVar71;
  auVar66._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar66._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar66._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar66._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar47 < iVar3) * iVar3 | (uint)(iVar47 >= iVar3) * iVar47;
  uVar107 = (uint)(iVar49 < iVar3) * iVar3 | (uint)(iVar49 >= iVar3) * iVar49;
  uVar110 = (uint)(iVar50 < iVar3) * iVar3 | (uint)(iVar50 >= iVar3) * iVar50;
  uVar113 = (uint)(iVar51 < iVar3) * iVar3 | (uint)(iVar51 >= iVar3) * iVar51;
  auVar117._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar117._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar117._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar117._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  auVar16 = pmulld(auVar65,auVar66);
  auVar36 = pmulld(auVar117,auVar15);
  auVar15 = pmulld(auVar66,auVar15);
  auVar31 = pmulld(auVar117,auVar42);
  auVar42 = pmulld(auVar103,auVar42);
  auVar35 = pmulld(auVar89,auVar35);
  iVar39 = iVar64 + auVar10._0_4_ >> auVar13;
  iVar40 = iVar68 + auVar10._4_4_ >> auVar13;
  iVar47 = iVar70 + auVar10._8_4_ >> auVar13;
  iVar49 = iVar72 + auVar10._12_4_ >> auVar13;
  iVar99 = iVar64 - auVar10._0_4_ >> auVar13;
  iVar106 = iVar68 - auVar10._4_4_ >> auVar13;
  iVar109 = iVar70 - auVar10._8_4_ >> auVar13;
  iVar112 = iVar72 - auVar10._12_4_ >> auVar13;
  iVar27 = auVar37._0_4_ + iVar7 + auVar12._0_4_ >> auVar13;
  iVar50 = auVar37._4_4_ + iVar7 + auVar12._4_4_ >> auVar13;
  iVar51 = auVar37._8_4_ + iVar7 + auVar12._8_4_ >> auVar13;
  iVar63 = auVar37._12_4_ + iVar7 + auVar12._12_4_ >> auVar13;
  iVar97 = iVar27 + iVar39;
  iVar81 = iVar50 + iVar40;
  iVar83 = iVar51 + iVar47;
  iVar85 = iVar63 + iVar49;
  iVar39 = iVar39 - iVar27;
  iVar40 = iVar40 - iVar50;
  iVar47 = iVar47 - iVar51;
  iVar49 = iVar49 - iVar63;
  iVar27 = auVar48._0_4_ + iVar7 + auVar43._0_4_ >> auVar13;
  iVar63 = auVar48._4_4_ + iVar7 + auVar43._4_4_ >> auVar13;
  iVar64 = auVar48._8_4_ + iVar7 + auVar43._8_4_ >> auVar13;
  iVar67 = auVar48._12_4_ + iVar7 + auVar43._12_4_ >> auVar13;
  iVar50 = iVar27 + iVar99;
  iVar51 = iVar63 + iVar106;
  iVar77 = iVar64 + iVar109;
  iVar79 = iVar67 + iVar112;
  iVar99 = iVar99 - iVar27;
  iVar106 = iVar106 - iVar63;
  iVar109 = iVar109 - iVar64;
  iVar112 = iVar112 - iVar67;
  uVar100 = (uint)(iVar29 < iVar3) * iVar3 | (uint)(iVar29 >= iVar3) * iVar29;
  uVar107 = (uint)(iVar32 < iVar3) * iVar3 | (uint)(iVar32 >= iVar3) * iVar32;
  uVar110 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar113 = (uint)(iVar34 < iVar3) * iVar3 | (uint)(iVar34 >= iVar3) * iVar34;
  auVar43._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar43._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar43._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar43._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar52 < iVar3) * iVar3 | (uint)(iVar52 >= iVar3) * iVar52;
  uVar107 = (uint)(iVar57 < iVar3) * iVar3 | (uint)(iVar57 >= iVar3) * iVar57;
  uVar110 = (uint)(iVar59 < iVar3) * iVar3 | (uint)(iVar59 >= iVar3) * iVar59;
  uVar113 = (uint)(iVar61 < iVar3) * iVar3 | (uint)(iVar61 >= iVar3) * iVar61;
  auVar56._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar56._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar56._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar56._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  auVar10 = pmulld(auVar43,auVar11);
  auVar12 = pmulld(auVar56,auVar11);
  uVar100 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar107 = (uint)(iVar17 < iVar3) * iVar3 | (uint)(iVar17 >= iVar3) * iVar17;
  uVar110 = (uint)(iVar19 < iVar3) * iVar3 | (uint)(iVar19 >= iVar3) * iVar19;
  uVar113 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar115 < iVar3) * iVar3 | (uint)(iVar115 >= iVar3) * iVar115;
  uVar58 = (uint)(iVar121 < iVar3) * iVar3 | (uint)(iVar121 >= iVar3) * iVar121;
  uVar60 = (uint)(iVar20 < iVar3) * iVar3 | (uint)(iVar20 >= iVar3) * iVar20;
  uVar62 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar53 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  uVar58 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar60 = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  uVar62 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar63 = uVar53 + uVar100;
  iVar68 = uVar58 + uVar107;
  iVar71 = uVar60 + uVar110;
  iVar93 = uVar62 + uVar113;
  iVar57 = uVar100 - uVar53;
  iVar67 = uVar107 - uVar58;
  iVar70 = uVar110 - uVar60;
  iVar87 = uVar113 - uVar62;
  iVar116 = auVar38._0_4_ + iVar7 + auVar30._0_4_ >> auVar13;
  iVar120 = auVar38._4_4_ + iVar7 + auVar30._4_4_ >> auVar13;
  iVar122 = auVar38._8_4_ + iVar7 + auVar30._8_4_ >> auVar13;
  iVar124 = auVar38._12_4_ + iVar7 + auVar30._12_4_ >> auVar13;
  iVar27 = auVar16._0_4_ + iVar7 + auVar36._0_4_ >> auVar13;
  iVar14 = auVar16._4_4_ + iVar7 + auVar36._4_4_ >> auVar13;
  iVar115 = auVar16._8_4_ + iVar7 + auVar36._8_4_ >> auVar13;
  iVar17 = auVar16._12_4_ + iVar7 + auVar36._12_4_ >> auVar13;
  iVar64 = iVar27 + iVar116;
  iVar69 = iVar14 + iVar120;
  iVar72 = iVar115 + iVar122;
  iVar95 = iVar17 + iVar124;
  iVar116 = iVar116 - iVar27;
  iVar120 = iVar120 - iVar14;
  iVar122 = iVar122 - iVar115;
  iVar124 = iVar124 - iVar17;
  uVar100 = (uint)(iVar46 < iVar3) * iVar3 | (uint)(iVar46 >= iVar3) * iVar46;
  uVar107 = (uint)(iVar123 < iVar3) * iVar3 | (uint)(iVar123 >= iVar3) * iVar123;
  uVar113 = (uint)(iVar21 < iVar3) * iVar3 | (uint)(iVar21 >= iVar3) * iVar21;
  uVar58 = (uint)(iVar25 < iVar3) * iVar3 | (uint)(iVar25 >= iVar3) * iVar25;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar110 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar53 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar60 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar107 = (uint)(iVar119 < iVar3) * iVar3 | (uint)(iVar119 >= iVar3) * iVar119;
  uVar113 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar58 = (uint)(iVar22 < iVar3) * iVar3 | (uint)(iVar22 >= iVar3) * iVar22;
  uVar62 = (uint)(iVar26 < iVar3) * iVar3 | (uint)(iVar26 >= iVar3) * iVar26;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar58 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar62 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar88 = uVar107 + uVar100;
  iVar94 = uVar113 + uVar110;
  iVar96 = uVar58 + uVar53;
  iVar98 = uVar62 + uVar60;
  iVar27 = uVar107 - uVar100;
  iVar115 = uVar113 - uVar110;
  iVar119 = uVar58 - uVar53;
  iVar121 = uVar62 - uVar60;
  iVar18 = auVar15._0_4_ + iVar7 + auVar31._0_4_ >> auVar13;
  iVar19 = auVar15._4_4_ + iVar7 + auVar31._4_4_ >> auVar13;
  iVar20 = auVar15._8_4_ + iVar7 + auVar31._8_4_ >> auVar13;
  iVar21 = auVar15._12_4_ + iVar7 + auVar31._12_4_ >> auVar13;
  iVar101 = auVar42._0_4_ + iVar7 + auVar35._0_4_ >> auVar13;
  iVar108 = auVar42._4_4_ + iVar7 + auVar35._4_4_ >> auVar13;
  iVar111 = auVar42._8_4_ + iVar7 + auVar35._8_4_ >> auVar13;
  iVar114 = auVar42._12_4_ + iVar7 + auVar35._12_4_ >> auVar13;
  iVar14 = iVar101 + iVar18;
  iVar46 = iVar108 + iVar19;
  iVar17 = iVar111 + iVar20;
  iVar123 = iVar114 + iVar21;
  iVar101 = iVar101 - iVar18;
  iVar108 = iVar108 - iVar19;
  iVar111 = iVar111 - iVar20;
  iVar114 = iVar114 - iVar21;
  uVar100 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar107 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar110 = (uint)(iVar41 < iVar3) * iVar3 | (uint)(iVar41 >= iVar3) * iVar41;
  uVar113 = (uint)(iVar45 < iVar3) * iVar3 | (uint)(iVar45 >= iVar3) * iVar45;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar97 < iVar3) * iVar3 | (uint)(iVar97 >= iVar3) * iVar97;
  uVar58 = (uint)(iVar81 < iVar3) * iVar3 | (uint)(iVar81 >= iVar3) * iVar81;
  uVar60 = (uint)(iVar83 < iVar3) * iVar3 | (uint)(iVar83 >= iVar3) * iVar83;
  uVar62 = (uint)(iVar85 < iVar3) * iVar3 | (uint)(iVar85 >= iVar3) * iVar85;
  uVar53 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  uVar58 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar60 = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  uVar62 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar97 = uVar53 + uVar100;
  iVar81 = uVar58 + uVar107;
  iVar83 = uVar60 + uVar110;
  iVar85 = uVar62 + uVar113;
  iVar22 = uVar53 - uVar100;
  iVar24 = uVar58 - uVar107;
  iVar26 = uVar60 - uVar110;
  iVar32 = uVar62 - uVar113;
  uVar100 = (uint)(iVar50 < iVar3) * iVar3 | (uint)(iVar50 >= iVar3) * iVar50;
  uVar107 = (uint)(iVar51 < iVar3) * iVar3 | (uint)(iVar51 >= iVar3) * iVar51;
  uVar110 = (uint)(iVar77 < iVar3) * iVar3 | (uint)(iVar77 >= iVar3) * iVar77;
  uVar113 = (uint)(iVar79 < iVar3) * iVar3 | (uint)(iVar79 >= iVar3) * iVar79;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  iVar34 = auVar10._0_4_ + iVar7 + auVar12._0_4_ >> auVar13;
  iVar50 = auVar10._4_4_ + iVar7 + auVar12._4_4_ >> auVar13;
  iVar51 = auVar10._8_4_ + iVar7 + auVar12._8_4_ >> auVar13;
  iVar59 = auVar10._12_4_ + iVar7 + auVar12._12_4_ >> auVar13;
  iVar79 = iVar34 + uVar100;
  iVar82 = iVar50 + uVar107;
  iVar84 = iVar51 + uVar110;
  iVar86 = iVar59 + uVar113;
  iVar34 = uVar100 - iVar34;
  iVar50 = uVar107 - iVar50;
  iVar51 = uVar110 - iVar51;
  iVar59 = uVar113 - iVar59;
  uVar100 = (uint)(iVar99 < iVar3) * iVar3 | (uint)(iVar99 >= iVar3) * iVar99;
  uVar107 = (uint)(iVar106 < iVar3) * iVar3 | (uint)(iVar106 >= iVar3) * iVar106;
  uVar110 = (uint)(iVar109 < iVar3) * iVar3 | (uint)(iVar109 >= iVar3) * iVar109;
  uVar113 = (uint)(iVar112 < iVar3) * iVar3 | (uint)(iVar112 >= iVar3) * iVar112;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  iVar18 = (iVar7 - auVar10._0_4_) + auVar12._0_4_ >> auVar13;
  iVar19 = (iVar7 - auVar10._4_4_) + auVar12._4_4_ >> auVar13;
  iVar20 = (iVar7 - auVar10._8_4_) + auVar12._8_4_ >> auVar13;
  iVar21 = (iVar7 - auVar10._12_4_) + auVar12._12_4_ >> auVar13;
  iVar2 = iVar18 + uVar100;
  iVar8 = iVar19 + uVar107;
  iVar41 = iVar20 + uVar110;
  iVar45 = iVar21 + uVar113;
  iVar18 = uVar100 - iVar18;
  iVar19 = uVar107 - iVar19;
  iVar20 = uVar110 - iVar20;
  iVar21 = uVar113 - iVar21;
  uVar100 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar107 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  uVar110 = (uint)(iVar9 < iVar3) * iVar3 | (uint)(iVar9 >= iVar3) * iVar9;
  uVar113 = (uint)(iVar44 < iVar3) * iVar3 | (uint)(iVar44 >= iVar3) * iVar44;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar39 < iVar3) * iVar3 | (uint)(iVar39 >= iVar3) * iVar39;
  uVar58 = (uint)(iVar40 < iVar3) * iVar3 | (uint)(iVar40 >= iVar3) * iVar40;
  uVar60 = (uint)(iVar47 < iVar3) * iVar3 | (uint)(iVar47 >= iVar3) * iVar47;
  uVar62 = (uint)(iVar49 < iVar3) * iVar3 | (uint)(iVar49 >= iVar3) * iVar49;
  uVar53 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  uVar58 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar60 = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  uVar62 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar39 = uVar53 + uVar100;
  iVar47 = uVar58 + uVar107;
  iVar52 = uVar60 + uVar110;
  iVar61 = uVar62 + uVar113;
  iVar23 = uVar53 - uVar100;
  iVar25 = uVar58 - uVar107;
  iVar29 = uVar60 - uVar110;
  iVar33 = uVar62 - uVar113;
  uVar100 = (uint)(iVar116 < iVar3) * iVar3 | (uint)(iVar116 >= iVar3) * iVar116;
  uVar107 = (uint)(iVar120 < iVar3) * iVar3 | (uint)(iVar120 >= iVar3) * iVar120;
  uVar110 = (uint)(iVar122 < iVar3) * iVar3 | (uint)(iVar122 >= iVar3) * iVar122;
  uVar113 = (uint)(iVar124 < iVar3) * iVar3 | (uint)(iVar124 >= iVar3) * iVar124;
  auVar118._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar118._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar118._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar118._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar101 < iVar3) * iVar3 | (uint)(iVar101 >= iVar3) * iVar101;
  uVar107 = (uint)(iVar108 < iVar3) * iVar3 | (uint)(iVar108 >= iVar3) * iVar108;
  uVar110 = (uint)(iVar111 < iVar3) * iVar3 | (uint)(iVar111 >= iVar3) * iVar111;
  uVar113 = (uint)(iVar114 < iVar3) * iVar3 | (uint)(iVar114 >= iVar3) * iVar114;
  auVar104._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar104._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar104._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar104._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  auVar15 = pmulld(auVar118,auVar11);
  auVar30 = pmulld(auVar104,auVar11);
  uVar100 = (uint)(iVar57 < iVar3) * iVar3 | (uint)(iVar57 >= iVar3) * iVar57;
  uVar107 = (uint)(iVar67 < iVar3) * iVar3 | (uint)(iVar67 >= iVar3) * iVar67;
  uVar110 = (uint)(iVar70 < iVar3) * iVar3 | (uint)(iVar70 >= iVar3) * iVar70;
  uVar113 = (uint)(iVar87 < iVar3) * iVar3 | (uint)(iVar87 >= iVar3) * iVar87;
  auVar105._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar105._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar105._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar105._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar115 < iVar3) * iVar3 | (uint)(iVar115 >= iVar3) * iVar115;
  uVar110 = (uint)(iVar119 < iVar3) * iVar3 | (uint)(iVar119 >= iVar3) * iVar119;
  uVar113 = (uint)(iVar121 < iVar3) * iVar3 | (uint)(iVar121 >= iVar3) * iVar121;
  auVar102._0_4_ = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  auVar102._4_4_ = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  auVar102._8_4_ = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  auVar102._12_4_ = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  auVar12 = pmulld(auVar105,auVar11);
  auVar10 = pmulld(auVar102,auVar11);
  iVar99 = (iVar7 - auVar15._0_4_) + auVar30._0_4_ >> auVar13;
  iVar106 = (iVar7 - auVar15._4_4_) + auVar30._4_4_ >> auVar13;
  iVar109 = (iVar7 - auVar15._8_4_) + auVar30._8_4_ >> auVar13;
  iVar112 = (iVar7 - auVar15._12_4_) + auVar30._12_4_ >> auVar13;
  iVar27 = auVar15._0_4_ + iVar7 + auVar30._0_4_ >> auVar13;
  iVar4 = auVar15._4_4_ + iVar7 + auVar30._4_4_ >> auVar13;
  iVar6 = auVar15._8_4_ + iVar7 + auVar30._8_4_ >> auVar13;
  iVar9 = auVar15._12_4_ + iVar7 + auVar30._12_4_ >> auVar13;
  iVar44 = (iVar7 - auVar12._0_4_) + auVar10._0_4_ >> auVar13;
  iVar115 = (iVar7 - auVar12._4_4_) + auVar10._4_4_ >> auVar13;
  iVar119 = (iVar7 - auVar12._8_4_) + auVar10._8_4_ >> auVar13;
  iVar121 = (iVar7 - auVar12._12_4_) + auVar10._12_4_ >> auVar13;
  iVar40 = auVar12._0_4_ + iVar7 + auVar10._0_4_ >> auVar13;
  iVar49 = auVar12._4_4_ + iVar7 + auVar10._4_4_ >> auVar13;
  iVar57 = auVar12._8_4_ + iVar7 + auVar10._8_4_ >> auVar13;
  iVar7 = auVar12._12_4_ + iVar7 + auVar10._12_4_ >> auVar13;
  uVar100 = (uint)(iVar88 < iVar3) * iVar3 | (uint)(iVar88 >= iVar3) * iVar88;
  uVar107 = (uint)(iVar94 < iVar3) * iVar3 | (uint)(iVar94 >= iVar3) * iVar94;
  uVar110 = (uint)(iVar96 < iVar3) * iVar3 | (uint)(iVar96 >= iVar3) * iVar96;
  uVar113 = (uint)(iVar98 < iVar3) * iVar3 | (uint)(iVar98 >= iVar3) * iVar98;
  uVar53 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar58 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar60 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar62 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar97 < iVar3) * iVar3 | (uint)(iVar97 >= iVar3) * iVar97;
  uVar107 = (uint)(iVar81 < iVar3) * iVar3 | (uint)(iVar81 >= iVar3) * iVar81;
  uVar110 = (uint)(iVar83 < iVar3) * iVar3 | (uint)(iVar83 >= iVar3) * iVar83;
  uVar113 = (uint)(iVar85 < iVar3) * iVar3 | (uint)(iVar85 >= iVar3) * iVar85;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  iVar67 = uVar100 + uVar53;
  iVar70 = uVar107 + uVar58;
  iVar87 = uVar110 + uVar60;
  iVar97 = uVar113 + uVar62;
  iVar81 = uVar100 - uVar53;
  iVar83 = uVar107 - uVar58;
  iVar85 = uVar110 - uVar60;
  iVar77 = uVar113 - uVar62;
  uVar100 = (uint)(iVar67 < iVar3) * iVar3 | (uint)(iVar67 >= iVar3) * iVar67;
  uVar107 = (uint)(iVar70 < iVar3) * iVar3 | (uint)(iVar70 >= iVar3) * iVar70;
  uVar110 = (uint)(iVar87 < iVar3) * iVar3 | (uint)(iVar87 >= iVar3) * iVar87;
  uVar113 = (uint)(iVar97 < iVar3) * iVar3 | (uint)(iVar97 >= iVar3) * iVar97;
  *(uint *)*out = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)*out + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(*out + 1) = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar81 < iVar3) * iVar3 | (uint)(iVar81 >= iVar3) * iVar81;
  uVar107 = (uint)(iVar83 < iVar3) * iVar3 | (uint)(iVar83 >= iVar3) * iVar83;
  uVar110 = (uint)(iVar85 < iVar3) * iVar3 | (uint)(iVar85 >= iVar3) * iVar85;
  uVar113 = (uint)(iVar77 < iVar3) * iVar3 | (uint)(iVar77 >= iVar3) * iVar77;
  *(uint *)out[0xf] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[0xf] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar107 = (uint)(iVar46 < iVar3) * iVar3 | (uint)(iVar46 >= iVar3) * iVar46;
  uVar110 = (uint)(iVar17 < iVar3) * iVar3 | (uint)(iVar17 >= iVar3) * iVar17;
  uVar113 = (uint)(iVar123 < iVar3) * iVar3 | (uint)(iVar123 >= iVar3) * iVar123;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar79 < iVar3) * iVar3 | (uint)(iVar79 >= iVar3) * iVar79;
  uVar58 = (uint)(iVar82 < iVar3) * iVar3 | (uint)(iVar82 >= iVar3) * iVar82;
  uVar60 = (uint)(iVar84 < iVar3) * iVar3 | (uint)(iVar84 >= iVar3) * iVar84;
  uVar62 = (uint)(iVar86 < iVar3) * iVar3 | (uint)(iVar86 >= iVar3) * iVar86;
  uVar53 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  uVar58 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar60 = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  uVar62 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar14 = uVar53 + uVar100;
  iVar46 = uVar58 + uVar107;
  iVar17 = uVar60 + uVar110;
  iVar123 = uVar62 + uVar113;
  iVar67 = uVar53 - uVar100;
  iVar70 = uVar58 - uVar107;
  iVar87 = uVar60 - uVar110;
  iVar97 = uVar62 - uVar113;
  uVar100 = (uint)(iVar14 < iVar3) * iVar3 | (uint)(iVar14 >= iVar3) * iVar14;
  uVar107 = (uint)(iVar46 < iVar3) * iVar3 | (uint)(iVar46 >= iVar3) * iVar46;
  uVar110 = (uint)(iVar17 < iVar3) * iVar3 | (uint)(iVar17 >= iVar3) * iVar17;
  uVar113 = (uint)(iVar123 < iVar3) * iVar3 | (uint)(iVar123 >= iVar3) * iVar123;
  *(uint *)out[1] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[1] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar107 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar110 = (uint)(iVar41 < iVar3) * iVar3 | (uint)(iVar41 >= iVar3) * iVar41;
  uVar113 = (uint)(iVar45 < iVar3) * iVar3 | (uint)(iVar45 >= iVar3) * iVar45;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar67 < iVar3) * iVar3 | (uint)(iVar67 >= iVar3) * iVar67;
  uVar58 = (uint)(iVar70 < iVar3) * iVar3 | (uint)(iVar70 >= iVar3) * iVar70;
  uVar60 = (uint)(iVar87 < iVar3) * iVar3 | (uint)(iVar87 >= iVar3) * iVar87;
  uVar62 = (uint)(iVar97 < iVar3) * iVar3 | (uint)(iVar97 >= iVar3) * iVar97;
  *(uint *)out[0xe] = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  *(uint *)(out[0xe] + 1) = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60
  ;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar2 = iVar27 + uVar100;
  iVar8 = iVar4 + uVar107;
  iVar41 = iVar6 + uVar110;
  iVar45 = iVar9 + uVar113;
  iVar27 = uVar100 - iVar27;
  iVar4 = uVar107 - iVar4;
  iVar6 = uVar110 - iVar6;
  iVar9 = uVar113 - iVar9;
  uVar100 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar107 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar110 = (uint)(iVar41 < iVar3) * iVar3 | (uint)(iVar41 >= iVar3) * iVar41;
  uVar113 = (uint)(iVar45 < iVar3) * iVar3 | (uint)(iVar45 >= iVar3) * iVar45;
  *(uint *)out[2] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[2] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar39 < iVar3) * iVar3 | (uint)(iVar39 >= iVar3) * iVar39;
  uVar107 = (uint)(iVar47 < iVar3) * iVar3 | (uint)(iVar47 >= iVar3) * iVar47;
  uVar110 = (uint)(iVar52 < iVar3) * iVar3 | (uint)(iVar52 >= iVar3) * iVar52;
  uVar113 = (uint)(iVar61 < iVar3) * iVar3 | (uint)(iVar61 >= iVar3) * iVar61;
  uVar53 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar58 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar60 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar62 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar110 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  uVar113 = (uint)(iVar9 < iVar3) * iVar3 | (uint)(iVar9 >= iVar3) * iVar9;
  *(uint *)out[0xd] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[0xd] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  iVar27 = iVar40 + uVar53;
  iVar4 = iVar49 + uVar58;
  iVar2 = iVar57 + uVar60;
  iVar6 = iVar7 + uVar62;
  iVar40 = uVar53 - iVar40;
  iVar49 = uVar58 - iVar49;
  iVar57 = uVar60 - iVar57;
  iVar7 = uVar62 - iVar7;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar110 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar113 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  *(uint *)out[3] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[3] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar23 < iVar3) * iVar3 | (uint)(iVar23 >= iVar3) * iVar23;
  uVar107 = (uint)(iVar25 < iVar3) * iVar3 | (uint)(iVar25 >= iVar3) * iVar25;
  uVar110 = (uint)(iVar29 < iVar3) * iVar3 | (uint)(iVar29 >= iVar3) * iVar29;
  uVar113 = (uint)(iVar33 < iVar3) * iVar3 | (uint)(iVar33 >= iVar3) * iVar33;
  uVar53 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar58 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar60 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar62 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar40 < iVar3) * iVar3 | (uint)(iVar40 >= iVar3) * iVar40;
  uVar107 = (uint)(iVar49 < iVar3) * iVar3 | (uint)(iVar49 >= iVar3) * iVar49;
  uVar110 = (uint)(iVar57 < iVar3) * iVar3 | (uint)(iVar57 >= iVar3) * iVar57;
  uVar113 = (uint)(iVar7 < iVar3) * iVar3 | (uint)(iVar7 >= iVar3) * iVar7;
  *(uint *)out[0xc] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[0xc] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  iVar27 = iVar44 + uVar53;
  iVar4 = iVar115 + uVar58;
  iVar2 = iVar119 + uVar60;
  iVar6 = iVar121 + uVar62;
  iVar44 = uVar53 - iVar44;
  iVar115 = uVar58 - iVar115;
  iVar119 = uVar60 - iVar119;
  iVar121 = uVar62 - iVar121;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar110 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar113 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  *(uint *)out[4] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[4] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar18 < iVar3) * iVar3 | (uint)(iVar18 >= iVar3) * iVar18;
  uVar107 = (uint)(iVar19 < iVar3) * iVar3 | (uint)(iVar19 >= iVar3) * iVar19;
  uVar110 = (uint)(iVar20 < iVar3) * iVar3 | (uint)(iVar20 >= iVar3) * iVar20;
  uVar113 = (uint)(iVar21 < iVar3) * iVar3 | (uint)(iVar21 >= iVar3) * iVar21;
  uVar53 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar58 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar60 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar62 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar44 < iVar3) * iVar3 | (uint)(iVar44 >= iVar3) * iVar44;
  uVar107 = (uint)(iVar115 < iVar3) * iVar3 | (uint)(iVar115 >= iVar3) * iVar115;
  uVar110 = (uint)(iVar119 < iVar3) * iVar3 | (uint)(iVar119 >= iVar3) * iVar119;
  uVar113 = (uint)(iVar121 < iVar3) * iVar3 | (uint)(iVar121 >= iVar3) * iVar121;
  *(uint *)out[0xb] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[0xb] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  iVar27 = uVar53 + iVar99;
  iVar4 = uVar58 + iVar106;
  iVar2 = uVar60 + iVar109;
  iVar6 = uVar62 + iVar112;
  iVar99 = uVar53 - iVar99;
  iVar106 = uVar58 - iVar106;
  iVar109 = uVar60 - iVar109;
  iVar112 = uVar62 - iVar112;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar110 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar113 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  *(uint *)out[5] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[5] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar64 < iVar3) * iVar3 | (uint)(iVar64 >= iVar3) * iVar64;
  uVar107 = (uint)(iVar69 < iVar3) * iVar3 | (uint)(iVar69 >= iVar3) * iVar69;
  uVar110 = (uint)(iVar72 < iVar3) * iVar3 | (uint)(iVar72 >= iVar3) * iVar72;
  uVar113 = (uint)(iVar95 < iVar3) * iVar3 | (uint)(iVar95 >= iVar3) * iVar95;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar34 < iVar3) * iVar3 | (uint)(iVar34 >= iVar3) * iVar34;
  uVar58 = (uint)(iVar50 < iVar3) * iVar3 | (uint)(iVar50 >= iVar3) * iVar50;
  uVar60 = (uint)(iVar51 < iVar3) * iVar3 | (uint)(iVar51 >= iVar3) * iVar51;
  uVar62 = (uint)(iVar59 < iVar3) * iVar3 | (uint)(iVar59 >= iVar3) * iVar59;
  uVar73 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  uVar76 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar78 = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  uVar80 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  uVar53 = (uint)(iVar99 < iVar3) * iVar3 | (uint)(iVar99 >= iVar3) * iVar99;
  uVar58 = (uint)(iVar106 < iVar3) * iVar3 | (uint)(iVar106 >= iVar3) * iVar106;
  uVar60 = (uint)(iVar109 < iVar3) * iVar3 | (uint)(iVar109 >= iVar3) * iVar109;
  uVar62 = (uint)(iVar112 < iVar3) * iVar3 | (uint)(iVar112 >= iVar3) * iVar112;
  *(uint *)out[10] = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  *(uint *)(out[10] + 1) = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  iVar27 = uVar73 + uVar100;
  iVar4 = uVar76 + uVar107;
  iVar2 = uVar78 + uVar110;
  iVar6 = uVar80 + uVar113;
  iVar7 = uVar73 - uVar100;
  iVar8 = uVar76 - uVar107;
  iVar9 = uVar78 - uVar110;
  iVar41 = uVar80 - uVar113;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar110 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar113 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  *(uint *)out[6] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[6] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar100 = (uint)(iVar63 < iVar3) * iVar3 | (uint)(iVar63 >= iVar3) * iVar63;
  uVar107 = (uint)(iVar68 < iVar3) * iVar3 | (uint)(iVar68 >= iVar3) * iVar68;
  uVar110 = (uint)(iVar71 < iVar3) * iVar3 | (uint)(iVar71 >= iVar3) * iVar71;
  uVar113 = (uint)(iVar93 < iVar3) * iVar3 | (uint)(iVar93 >= iVar3) * iVar93;
  uVar100 = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  uVar107 = (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  uVar110 = (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  uVar113 = (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  uVar53 = (uint)(iVar22 < iVar3) * iVar3 | (uint)(iVar22 >= iVar3) * iVar22;
  uVar58 = (uint)(iVar24 < iVar3) * iVar3 | (uint)(iVar24 >= iVar3) * iVar24;
  uVar60 = (uint)(iVar26 < iVar3) * iVar3 | (uint)(iVar26 >= iVar3) * iVar26;
  uVar62 = (uint)(iVar32 < iVar3) * iVar3 | (uint)(iVar32 >= iVar3) * iVar32;
  uVar53 = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  uVar58 = (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  uVar60 = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  uVar62 = (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  uVar73 = (uint)(iVar7 < iVar3) * iVar3 | (uint)(iVar7 >= iVar3) * iVar7;
  uVar76 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar78 = (uint)(iVar9 < iVar3) * iVar3 | (uint)(iVar9 >= iVar3) * iVar9;
  uVar80 = (uint)(iVar41 < iVar3) * iVar3 | (uint)(iVar41 >= iVar3) * iVar41;
  *(uint *)out[9] = (uint)(iVar28 < (int)uVar73) * iVar28 | (iVar28 >= (int)uVar73) * uVar73;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar28 < (int)uVar76) * iVar28 | (iVar28 >= (int)uVar76) * uVar76;
  *(uint *)(out[9] + 1) = (uint)(iVar28 < (int)uVar78) * iVar28 | (iVar28 >= (int)uVar78) * uVar78;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar28 < (int)uVar80) * iVar28 | (iVar28 >= (int)uVar80) * uVar80;
  iVar27 = uVar53 + uVar100;
  iVar4 = uVar58 + uVar107;
  iVar2 = uVar60 + uVar110;
  iVar6 = uVar62 + uVar113;
  iVar7 = uVar53 - uVar100;
  iVar8 = uVar58 - uVar107;
  iVar9 = uVar60 - uVar110;
  iVar41 = uVar62 - uVar113;
  uVar100 = (uint)(iVar27 < iVar3) * iVar3 | (uint)(iVar27 >= iVar3) * iVar27;
  uVar107 = (uint)(iVar4 < iVar3) * iVar3 | (uint)(iVar4 >= iVar3) * iVar4;
  uVar110 = (uint)(iVar2 < iVar3) * iVar3 | (uint)(iVar2 >= iVar3) * iVar2;
  uVar113 = (uint)(iVar6 < iVar3) * iVar3 | (uint)(iVar6 >= iVar3) * iVar6;
  uVar53 = (uint)(iVar7 < iVar3) * iVar3 | (uint)(iVar7 >= iVar3) * iVar7;
  uVar58 = (uint)(iVar8 < iVar3) * iVar3 | (uint)(iVar8 >= iVar3) * iVar8;
  uVar60 = (uint)(iVar9 < iVar3) * iVar3 | (uint)(iVar9 >= iVar3) * iVar9;
  uVar62 = (uint)(iVar41 < iVar3) * iVar3 | (uint)(iVar41 >= iVar3) * iVar41;
  *(uint *)out[7] = (uint)(iVar28 < (int)uVar100) * iVar28 | (iVar28 >= (int)uVar100) * uVar100;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar28 < (int)uVar107) * iVar28 | (iVar28 >= (int)uVar107) * uVar107;
  *(uint *)(out[7] + 1) =
       (uint)(iVar28 < (int)uVar110) * iVar28 | (iVar28 >= (int)uVar110) * uVar110;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar28 < (int)uVar113) * iVar28 | (iVar28 >= (int)uVar113) * uVar113;
  *(uint *)out[8] = (uint)(iVar28 < (int)uVar53) * iVar28 | (iVar28 >= (int)uVar53) * uVar53;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar28 < (int)uVar58) * iVar28 | (iVar28 >= (int)uVar58) * uVar58;
  *(uint *)(out[8] + 1) = (uint)(iVar28 < (int)uVar60) * iVar28 | (iVar28 >= (int)uVar60) * uVar60;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar28 < (int)uVar62) * iVar28 | (iVar28 >= (int)uVar62) * uVar62;
  if (do_cols == 0) {
    iVar27 = 10;
    if (10 < bd) {
      iVar27 = bd;
    }
    local_48 = 0x20 << ((byte)iVar27 & 0x1f);
    local_38 = -local_48;
    local_48 = local_48 + -1;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    iStack_34 = local_38;
    iStack_30 = local_38;
    iStack_2c = local_38;
    round_shift_8x8(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_38,(__m128i *)&local_48,0x10);
  }
  return;
}

Assistant:

static void idct16x16_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                             int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospim4 = _mm_set1_epi32(-cospi[4]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospim20 = _mm_set1_epi32(-cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i cospi52 = _mm_set1_epi32(cospi[52]);
  const __m128i cospi36 = _mm_set1_epi32(cospi[36]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], v[16], x, y;

  {
    // stage 0
    // stage 1
    u[0] = in[0];
    u[1] = in[8];
    u[2] = in[4];
    u[3] = in[12];
    u[4] = in[2];
    u[5] = in[10];
    u[6] = in[6];
    u[7] = in[14];
    u[8] = in[1];
    u[9] = in[9];
    u[10] = in[5];
    u[11] = in[13];
    u[12] = in[3];
    u[13] = in[11];
    u[14] = in[7];
    u[15] = in[15];

    // stage 2
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = half_btf_sse4_1(&cospi60, &u[8], &cospim4, &u[15], &rnding, bit);
    v[9] = half_btf_sse4_1(&cospi28, &u[9], &cospim36, &u[14], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospi44, &u[10], &cospim20, &u[13], &rnding, bit);
    v[11] = half_btf_sse4_1(&cospi12, &u[11], &cospim52, &u[12], &rnding, bit);
    v[12] = half_btf_sse4_1(&cospi52, &u[11], &cospi12, &u[12], &rnding, bit);
    v[13] = half_btf_sse4_1(&cospi20, &u[10], &cospi44, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi36, &u[9], &cospi28, &u[14], &rnding, bit);
    v[15] = half_btf_sse4_1(&cospi4, &u[8], &cospi60, &u[15], &rnding, bit);

    // stage 3
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];
    u[4] = half_btf_sse4_1(&cospi56, &v[4], &cospim8, &v[7], &rnding, bit);
    u[5] = half_btf_sse4_1(&cospi24, &v[5], &cospim40, &v[6], &rnding, bit);
    u[6] = half_btf_sse4_1(&cospi40, &v[5], &cospi24, &v[6], &rnding, bit);
    u[7] = half_btf_sse4_1(&cospi8, &v[4], &cospi56, &v[7], &rnding, bit);
    addsub_sse4_1(v[8], v[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[11], v[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[12], v[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[15], v[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

    // stage 4
    x = _mm_mullo_epi32(u[0], cospi32);
    y = _mm_mullo_epi32(u[1], cospi32);
    v[0] = _mm_add_epi32(x, y);
    v[0] = _mm_add_epi32(v[0], rnding);
    v[0] = _mm_srai_epi32(v[0], bit);

    v[1] = _mm_sub_epi32(x, y);
    v[1] = _mm_add_epi32(v[1], rnding);
    v[1] = _mm_srai_epi32(v[1], bit);

    v[2] = half_btf_sse4_1(&cospi48, &u[2], &cospim16, &u[3], &rnding, bit);
    v[3] = half_btf_sse4_1(&cospi16, &u[2], &cospi48, &u[3], &rnding, bit);
    addsub_sse4_1(u[4], u[5], &v[4], &v[5], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[7], u[6], &v[7], &v[6], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
    v[10] = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
    v[11] = u[11];
    v[12] = u[12];
    v[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
    v[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
    v[15] = u[15];

    // stage 5
    addsub_sse4_1(v[0], v[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[1], v[2], &u[1], &u[2], &clamp_lo, &clamp_hi);
    u[4] = v[4];

    x = _mm_mullo_epi32(v[5], cospi32);
    y = _mm_mullo_epi32(v[6], cospi32);
    u[5] = _mm_sub_epi32(y, x);
    u[5] = _mm_add_epi32(u[5], rnding);
    u[5] = _mm_srai_epi32(u[5], bit);

    u[6] = _mm_add_epi32(y, x);
    u[6] = _mm_add_epi32(u[6], rnding);
    u[6] = _mm_srai_epi32(u[6], bit);

    u[7] = v[7];
    addsub_sse4_1(v[8], v[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[9], v[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[15], v[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[14], v[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

    // stage 6
    addsub_sse4_1(u[0], u[7], &v[0], &v[7], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[1], u[6], &v[1], &v[6], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[2], u[5], &v[2], &v[5], &clamp_lo, &clamp_hi);
    addsub_sse4_1(u[3], u[4], &v[3], &v[4], &clamp_lo, &clamp_hi);
    v[8] = u[8];
    v[9] = u[9];

    x = _mm_mullo_epi32(u[10], cospi32);
    y = _mm_mullo_epi32(u[13], cospi32);
    v[10] = _mm_sub_epi32(y, x);
    v[10] = _mm_add_epi32(v[10], rnding);
    v[10] = _mm_srai_epi32(v[10], bit);

    v[13] = _mm_add_epi32(x, y);
    v[13] = _mm_add_epi32(v[13], rnding);
    v[13] = _mm_srai_epi32(v[13], bit);

    x = _mm_mullo_epi32(u[11], cospi32);
    y = _mm_mullo_epi32(u[12], cospi32);
    v[11] = _mm_sub_epi32(y, x);
    v[11] = _mm_add_epi32(v[11], rnding);
    v[11] = _mm_srai_epi32(v[11], bit);

    v[12] = _mm_add_epi32(x, y);
    v[12] = _mm_add_epi32(v[12], rnding);
    v[12] = _mm_srai_epi32(v[12], bit);

    v[14] = u[14];
    v[15] = u[15];

    // stage 7
    addsub_sse4_1(v[0], v[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[1], v[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[2], v[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[3], v[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[4], v[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[5], v[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[6], v[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
    addsub_sse4_1(v[7], v[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

    if (!do_cols) {
      const int log_range_out = AOMMAX(16, bd + 6);
      const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
      const __m128i clamp_hi_out =
          _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
      round_shift_8x8(out, out_shift);
      highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
    }
  }
}